

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O1

void __thiscall
OPNMIDIplay::noteUpdate
          (OPNMIDIplay *this,size_t midCh,notes_iterator i,uint props_mask,int32_t select_adlchn)

{
  uint32_t *puVar1;
  ushort uVar2;
  uint uVar3;
  OPN2 *pOVar4;
  pointer pOVar5;
  pl_cell<OPNMIDIplay::OpnChannel::LocationData> *ppVar6;
  NoteHook p_Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  users_iterator uVar12;
  pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData> *ppVar13;
  pl_cell<OPNMIDIplay::OpnChannel::LocationData> *ppVar14;
  int iVar15;
  OpnTimbre *instrument;
  byte bVar16;
  byte bVar17;
  Phys *pPVar18;
  pointer pMVar19;
  long lVar20;
  double c;
  ulong uVar21;
  Phys *ph;
  bool bVar22;
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  Location my_loc;
  Location local_a8;
  int local_a4;
  double local_a0;
  long local_98;
  Phys *local_90;
  OPN2 *local_88;
  double local_80;
  size_t local_78;
  size_t local_70;
  OpnInstMeta *local_68;
  ulong local_60;
  double local_58;
  double local_50;
  pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *local_48;
  double local_40;
  NoteInfo *local_38;
  
  pOVar4 = (this->m_synth).m_p;
  local_a4 = (int)((i.cell_)->value).noteTone;
  local_40 = ((i.cell_)->value).currentTone;
  local_60 = (ulong)((i.cell_)->value).vol;
  local_70 = ((i.cell_)->value).midiins;
  local_68 = ((i.cell_)->value).ains;
  local_a8.note = ((i.cell_)->value).note;
  local_a8.MidCh = (uint16_t)midCh;
  local_78 = midCh;
  if (((i.cell_)->value).isBlank == true) {
    if ((props_mask & 0x20) == 0) {
      return;
    }
    pMVar19 = (this->m_midiChannels).
              super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
              ._M_impl.super__Vector_impl_data._M_start + midCh;
  }
  else {
    uVar21 = (ulong)((i.cell_)->value).chip_channels_count;
    local_88 = pOVar4;
    if (uVar21 != 0) {
      pPVar18 = ((i.cell_)->value).chip_channels;
      do {
        instrument = &pPVar18->ains;
        uVar2 = *(ushort *)((long)(instrument + -1) + 0x1e);
        if (((props_mask & 1) != 0) && (select_adlchn < 0 || (uint)uVar2 == select_adlchn)) {
          OPN2::setPatch(local_88,(ulong)uVar2,instrument);
          uVar12 = OpnChannel::find_or_create_user
                             ((this->m_chipChannels).
                              super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar2,&local_a8);
          if (((uVar12.cell_)->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next !=
              (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0) {
            ((uVar12.cell_)->value).sustained = 0;
            ((uVar12.cell_)->value).vibdelay_us = 0;
            uVar2 = local_68->soundKeyOnMs;
            ((uVar12.cell_)->value).fixed_sustain = (ulong)uVar2 == 40000;
            ((uVar12.cell_)->value).kon_time_until_neglible_us = (ulong)uVar2 * 1000;
            uVar8 = *(undefined8 *)((long)(instrument + -1) + 0x1e);
            uVar9 = *(undefined8 *)(instrument->OPS[0].data + 6);
            uVar10 = *(undefined8 *)(instrument->OPS + 2);
            uVar11 = *(undefined8 *)(instrument->OPS[3].data + 1);
            ((uVar12.cell_)->value).ins.chip_chan = (short)uVar8;
            ((uVar12.cell_)->value).ins.ains.OPS[0].data[0] = (char)((ulong)uVar8 >> 0x10);
            ((uVar12.cell_)->value).ins.ains.OPS[0].data[1] = (char)((ulong)uVar8 >> 0x18);
            ((uVar12.cell_)->value).ins.ains.OPS[0].data[2] = (char)((ulong)uVar8 >> 0x20);
            ((uVar12.cell_)->value).ins.ains.OPS[0].data[3] = (char)((ulong)uVar8 >> 0x28);
            ((uVar12.cell_)->value).ins.ains.OPS[0].data[4] = (char)((ulong)uVar8 >> 0x30);
            ((uVar12.cell_)->value).ins.ains.OPS[0].data[5] = (char)((ulong)uVar8 >> 0x38);
            *(undefined8 *)(((uVar12.cell_)->value).ins.ains.OPS[0].data + 6) = uVar9;
            *(undefined8 *)(((uVar12.cell_)->value).ins.ains.OPS + 2) = uVar10;
            *(undefined8 *)(((uVar12.cell_)->value).ins.ains.OPS[3].data + 1) = uVar11;
            ((uVar12.cell_)->value).ins.ains.noteOffset = instrument->noteOffset;
          }
        }
        pPVar18 = (Phys *)(instrument + 1);
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
    }
    if (((i.cell_)->value).chip_channels_count != 0) {
      local_38 = &(i.cell_)->value;
      pPVar18 = ((i.cell_)->value).chip_channels;
      uVar21 = 0;
      lVar20 = local_78 * 0x140;
      local_98 = lVar20;
      local_90 = pPVar18;
      local_48 = i.cell_;
      do {
        iVar15 = (int)uVar21;
        uVar2 = pPVar18[uVar21].chip_chan;
        c = (double)(ulong)uVar2;
        if ((select_adlchn < 0) || ((uint)uVar2 == select_adlchn)) {
          ph = pPVar18 + uVar21;
          if ((props_mask & 0x20) == 0) {
            if ((props_mask & 2) != 0) {
              OPN2::setPan(local_88,(size_t)c,
                           ((this->m_midiChannels).
                            super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                            ._M_impl.super__Vector_impl_data._M_start)->noteAftertouch
                           [lVar20 + 0xffffffffffffffe9]);
              pPVar18 = local_90;
              lVar20 = local_98;
            }
            if ((props_mask & 4) != 0) {
              pMVar19 = (this->m_midiChannels).
                        super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar17 = pMVar19->_padding2[lVar20 + 0xfffffffffffffffe];
              if ((pMVar19->_padding2[lVar20 + 0xffffffffffffffff] & 1U) != 0) {
                bVar17 = 0x7f;
              }
              if (local_78 == 9) {
                bVar17 = 0x7f;
              }
              bVar16 = bVar17 * '\x02';
              if (0x3f < bVar17) {
                bVar16 = 0x7f;
              }
              if ((this->m_setup).fullRangeBrightnessCC74 != false) {
                bVar16 = bVar17;
              }
              OPN2::touchNote(local_88,(size_t)c,local_60,
                              (ulong)pMVar19->noteAftertouch[lVar20 + 0xffffffffffffffe7],
                              (ulong)pMVar19->noteAftertouch[lVar20 + 0xffffffffffffffe8],bVar16);
              pPVar18 = local_90;
              lVar20 = local_98;
            }
            if ((props_mask & 8) != 0) {
              pOVar5 = (this->m_chipChannels).
                       super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar13 = &pOVar5[(long)c].users.endcell_;
              for (ppVar6 = pOVar5[(long)c].users.first_;
                  (ppVar14 = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)ppVar13,
                  ppVar6 != (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)ppVar13 &&
                  ((*(uint16_t *)&ppVar6->value != local_a8.MidCh ||
                   (ppVar14 = ppVar6, *(uint8_t *)((long)&ppVar6->value + 2) != local_a8.note))));
                  ppVar6 = *(pl_cell<OPNMIDIplay::OpnChannel::LocationData> **)
                            ((long)&ppVar6->
                                    super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData> + 8))
              {
              }
              if (((ppVar14->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next ==
                   (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0) ||
                 (*(int *)((bool *)((long)ppVar14 + 0x10) + 4) == 0)) {
                pMVar19 = (this->m_midiChannels).
                          super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar17 = pMVar19->noteAftertouch[lVar20 + 0xffffffffffffffeb];
                if (pMVar19->noteAftertouch[lVar20 + 0xffffffffffffffeb] <
                    pMVar19->noteAftertouch[lVar20 + 0xffffffffffffffea]) {
                  bVar17 = pMVar19->noteAftertouch[lVar20 + 0xffffffffffffffea];
                }
                bVar16 = ((i.cell_)->value).vibrato;
                if (bVar17 <= bVar16) {
                  bVar17 = bVar16;
                }
                dVar26 = 0.0;
                if (((local_68->flags & 1) != 0) &&
                   (auVar25[0] = -(local_68->op[1].OPS[0].data[0] == (ph->ains).OPS[0].data[0]),
                   auVar25[1] = -(local_68->op[1].OPS[0].data[1] == (ph->ains).OPS[0].data[1]),
                   auVar25[2] = -(local_68->op[1].OPS[0].data[2] == (ph->ains).OPS[0].data[2]),
                   auVar25[3] = -(local_68->op[1].OPS[0].data[3] == (ph->ains).OPS[0].data[3]),
                   auVar25[4] = -(local_68->op[1].OPS[0].data[4] == (ph->ains).OPS[0].data[4]),
                   auVar25[5] = -(local_68->op[1].OPS[0].data[5] == (ph->ains).OPS[0].data[5]),
                   auVar25[6] = -(local_68->op[1].OPS[0].data[6] == (ph->ains).OPS[0].data[6]),
                   auVar25[7] = -(local_68->op[1].OPS[1].data[0] == (ph->ains).OPS[1].data[0]),
                   auVar25[8] = -(local_68->op[1].OPS[1].data[1] == (ph->ains).OPS[1].data[1]),
                   auVar25[9] = -(local_68->op[1].OPS[1].data[2] == (ph->ains).OPS[1].data[2]),
                   auVar25[10] = -(local_68->op[1].OPS[1].data[3] == (ph->ains).OPS[1].data[3]),
                   auVar25[0xb] = -(local_68->op[1].OPS[1].data[4] == (ph->ains).OPS[1].data[4]),
                   auVar25[0xc] = -(local_68->op[1].OPS[1].data[5] == (ph->ains).OPS[1].data[5]),
                   auVar25[0xd] = -(local_68->op[1].OPS[1].data[6] == (ph->ains).OPS[1].data[6]),
                   auVar25[0xe] = -(local_68->op[1].OPS[2].data[0] == (ph->ains).OPS[2].data[0]),
                   auVar25[0xf] = -(local_68->op[1].OPS[2].data[1] == (ph->ains).OPS[2].data[1]),
                   auVar23[0] = -(local_68->op[1].OPS[2].data[2] == (ph->ains).OPS[2].data[2]),
                   auVar23[1] = -(local_68->op[1].OPS[2].data[3] == (ph->ains).OPS[2].data[3]),
                   auVar23[2] = -(local_68->op[1].OPS[2].data[4] == (ph->ains).OPS[2].data[4]),
                   auVar23[3] = -(local_68->op[1].OPS[2].data[5] == (ph->ains).OPS[2].data[5]),
                   auVar23[4] = -(local_68->op[1].OPS[2].data[6] == (ph->ains).OPS[2].data[6]),
                   auVar23[5] = -(local_68->op[1].OPS[3].data[0] == (ph->ains).OPS[3].data[0]),
                   auVar23[6] = -(local_68->op[1].OPS[3].data[1] == (ph->ains).OPS[3].data[1]),
                   auVar23[7] = -(local_68->op[1].OPS[3].data[2] == (ph->ains).OPS[3].data[2]),
                   auVar23[8] = -(local_68->op[1].OPS[3].data[3] == (ph->ains).OPS[3].data[3]),
                   auVar23[9] = -(local_68->op[1].OPS[3].data[4] == (ph->ains).OPS[3].data[4]),
                   auVar23[10] = -(local_68->op[1].OPS[3].data[5] == (ph->ains).OPS[3].data[5]),
                   auVar23[0xb] = -(local_68->op[1].OPS[3].data[6] == (ph->ains).OPS[3].data[6]),
                   auVar23[0xc] = -(local_68->op[1].fbalg == (ph->ains).fbalg),
                   auVar23[0xd] = -(local_68->op[1].lfosens == (ph->ains).lfosens),
                   auVar23[0xe] = -((char)local_68->op[1].noteOffset == (char)(ph->ains).noteOffset)
                   , auVar23[0xf] = -(*(char *)((long)&local_68->op[1].noteOffset + 1) ==
                                     *(char *)((long)&(ph->ains).noteOffset + 1)),
                   auVar23 = auVar23 & auVar25,
                   (ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff)) {
                  dVar26 = local_68->voice2_fine_tune;
                }
                local_a0 = (double)*(int *)(pMVar19->_padding + lVar20 + 7) *
                           *(double *)(pMVar19->_padding + lVar20 + 0xf);
                dVar24 = (double)(int)(ph->ains).noteOffset + local_a0;
                if ((bVar17 != 0) &&
                   (((ppVar14->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next ==
                     (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0 ||
                    (*(long *)(pMVar19->_padding2 + lVar20 + 0xfffffffffffffff3) <=
                     *(long *)((long)((long)ppVar14 + 0x40) + 8))))) {
                  local_58 = (double)bVar17 *
                             *(double *)(pMVar19->_padding2 + lVar20 + 0xffffffffffffffeb);
                  local_80 = dVar26;
                  local_50 = dVar24;
                  dVar26 = sin(*(double *)(pMVar19->_padding + lVar20 + 0x1f));
                  dVar24 = local_50 + dVar26 * local_58;
                  dVar26 = local_80;
                }
                OPN2::noteOn(local_88,(size_t)c,dVar26 + dVar24 + local_40);
                p_Var7 = (this->hooks).onNote;
                pPVar18 = local_90;
                lVar20 = local_98;
                if (p_Var7 != (NoteHook)0x0) {
                  (*p_Var7)((this->hooks).onNote_userData,(uint)uVar2,local_a4,(int)local_70,
                            (int)local_60,local_a0);
                  pPVar18 = local_90;
                  lVar20 = local_98;
                }
              }
            }
          }
          else {
            if (((this->m_midiChannels).
                 super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                 ._M_impl.super__Vector_impl_data._M_start)->noteAftertouch
                [lVar20 + 0xffffffffffffffee] == '\0') {
              pOVar5 = (this->m_chipChannels).
                       super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_a0 = (double)((long)c * 0x70);
              ppVar13 = &pOVar5[(long)c].users.endcell_;
              ppVar6 = pOVar5[(long)c].users.first_;
              while ((ppVar14 = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)ppVar13,
                     ppVar6 != (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)ppVar13 &&
                     (((ppVar6->value).loc.MidCh != local_a8.MidCh ||
                      (ppVar14 = ppVar6, (ppVar6->value).loc.note != local_a8.note))))) {
                ppVar6 = (ppVar6->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next;
              }
              if ((ppVar14->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next ==
                  (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0) {
                bVar22 = false;
              }
              else {
                bVar22 = ((ppVar14->value).sustained & 2) == 0;
              }
              local_80 = c;
              if (bVar22) {
                pl_list<OPNMIDIplay::OpnChannel::LocationData>::deallocate
                          (&pOVar5[(long)c].users,ppVar14);
              }
              p_Var7 = (this->hooks).onNote;
              if (p_Var7 != (NoteHook)0x0) {
                (*p_Var7)((this->hooks).onNote_userData,(uint)uVar2,local_a4,(int)local_70,0,0.0);
              }
              i.cell_ = local_48;
              pOVar4 = local_88;
              if ((bVar22) &&
                 (*(long *)((long)(&((this->m_chipChannels).
                                     super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->recent_ins + 1) +
                           (long)local_a0 + 6) == 0)) {
                OPN2::noteOff(local_88,(size_t)local_80);
                if ((props_mask & 0x40) == 0) {
                  *(ulong *)((long)(((this->m_chipChannels).
                                     super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->recent_ins).ains.
                                   OPS + (long)local_a0 + 0xfffffffffffffff6U) =
                       (ulong)local_68->soundKeyOffMs * 1000;
                }
                else {
                  OPN2::touchNote(pOVar4,(size_t)local_80,0,0x7f,0x7f,'\x7f');
                  *(undefined8 *)
                   ((long)(((this->m_chipChannels).
                            super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                            ._M_impl.super__Vector_impl_data._M_start)->recent_ins).ains.OPS +
                   (long)local_a0 + 0xfffffffffffffff6U) = 0;
                }
              }
            }
            else {
              uVar12 = OpnChannel::find_or_create_user
                                 ((this->m_chipChannels).
                                  super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (long)c,&local_a8);
              if (((uVar12.cell_)->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next
                  != (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0) {
                puVar1 = &((uVar12.cell_)->value).sustained;
                *(byte *)puVar1 = (byte)*puVar1 | 1;
              }
              p_Var7 = (this->hooks).onNote;
              if (p_Var7 != (NoteHook)0x0) {
                (*p_Var7)((this->hooks).onNote_userData,(uint)uVar2,local_a4,(int)local_70,-1,0.0);
              }
            }
            MIDIchannel::NoteInfo::phys_erase_at(local_38,ph);
            iVar15 = iVar15 + -1;
            pPVar18 = local_90;
            lVar20 = local_98;
          }
        }
        uVar21 = (ulong)(iVar15 + 1U);
        uVar3 = ((i.cell_)->value).chip_channels_count;
      } while (iVar15 + 1U < uVar3);
      if (uVar3 != 0) {
        return;
      }
    }
    pMVar19 = (this->m_midiChannels).
              super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
              ._M_impl.super__Vector_impl_data._M_start + local_78;
    if (((i.cell_)->value).glideRate < INFINITY) {
      pMVar19->gliding_note_count = pMVar19->gliding_note_count - 1;
    }
    if (0.0 < ((i.cell_)->value).ttl) {
      pMVar19->extended_note_count = pMVar19->extended_note_count - 1;
    }
  }
  pl_list<OPNMIDIplay::MIDIchannel::NoteInfo>::deallocate(&pMVar19->activenotes,i.cell_);
  return;
}

Assistant:

void OPNMIDIplay::noteUpdate(size_t midCh,
                          OPNMIDIplay::MIDIchannel::notes_iterator i,
                          unsigned props_mask,
                          int32_t select_adlchn)
{
    Synth &synth = *m_synth;
    MIDIchannel::NoteInfo &info = i->value;
    const int16_t noteTone    = info.noteTone;
    const double currentTone    = info.currentTone;
    const uint8_t vol     = info.vol;
    const size_t midiins = info.midiins;
    const OpnInstMeta &ains = *info.ains;
    OpnChannel::Location my_loc;
    my_loc.MidCh = static_cast<uint16_t>(midCh);
    my_loc.note  = info.note;

    if(info.isBlank)
    {
        if(props_mask & Upd_Off)
            m_midiChannels[midCh].activenotes.erase(i);
        return;
    }

    for(unsigned ccount = 0, ctotal = info.chip_channels_count; ccount < ctotal; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c   = ins.chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn) continue;

        if(props_mask & Upd_Patch)
        {
            synth.setPatch(c, ins.ains);
            OpnChannel::users_iterator ci = m_chipChannels[c].find_or_create_user(my_loc);
            if(!ci.is_end())    // inserts if necessary
            {
                OpnChannel::LocationData &d = ci->value;
                d.sustained = OpnChannel::LocationData::Sustain_None;
                d.vibdelay_us  = 0;
                d.fixed_sustain = (ains.soundKeyOnMs == static_cast<uint16_t>(opnNoteOnMaxTime));
                d.kon_time_until_neglible_us = 1000 * ains.soundKeyOnMs;
                d.ins       = ins;
            }
        }
    }

    for(unsigned ccount = 0; ccount < info.chip_channels_count; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c   = ins.chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn)
            continue;

        if(props_mask & Upd_Off) // note off
        {
            if(m_midiChannels[midCh].sustain == 0)
            {
                OpnChannel::users_iterator k = m_chipChannels[c].find_user(my_loc);
                bool do_erase_user = (!k.is_end() && ((k->value.sustained & OpnChannel::LocationData::Sustain_Sostenuto) == 0));
                if(do_erase_user)
                    m_chipChannels[c].users.erase(k);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, static_cast<int>(midiins), 0, 0.0);

                if(do_erase_user && m_chipChannels[c].users.empty())
                {
                    synth.noteOff(c);
                    if(props_mask & Upd_Mute) // Mute the note
                    {
                        synth.touchNote(c, 0);
                        m_chipChannels[c].koff_time_until_neglible_us = 0;
                    }
                    else
                    {
                        m_chipChannels[c].koff_time_until_neglible_us = 1000 * int64_t(ains.soundKeyOffMs);
                    }
                }
            }
            else
            {
                // Sustain: Forget about the note, but don't key it off.
                //          Also will avoid overwriting it very soon.
                OpnChannel::users_iterator d = m_chipChannels[c].find_or_create_user(my_loc);
                if(!d.is_end())
                    d->value.sustained |= OpnChannel::LocationData::Sustain_Pedal; // note: not erased!
                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, static_cast<int>(midiins), -1, 0.0);
            }

            info.phys_erase_at(&ins);  // decrements channel count
            --ccount;  // adjusts index accordingly
            continue;
        }

        if(props_mask & Upd_Pan)
            synth.setPan(c, m_midiChannels[midCh].panning);

        if(props_mask & Upd_Volume)
        {
            const MIDIchannel &ch = m_midiChannels[midCh];
            bool is_percussion = (midCh == 9) || ch.is_xg_percussion;
            uint_fast32_t brightness = is_percussion ? 127 : ch.brightness;

            if(!m_setup.fullRangeBrightnessCC74)
            {
                // Simulate post-High-Pass filter result which affects sounding by half level only
                if(brightness >= 64)
                    brightness = 127;
                else
                    brightness *= 2;
            }

            synth.touchNote(c,
                            vol,
                            ch.volume,
                            ch.expression,
                            static_cast<uint8_t>(brightness));
        }

        if(props_mask & Upd_Pitch)
        {
            OpnChannel::users_iterator d = m_chipChannels[c].find_user(my_loc);

            // Don't bend a sustained note
            if(d.is_end() || (d->value.sustained == OpnChannel::LocationData::Sustain_None))
            {
                MIDIchannel &chan = m_midiChannels[midCh];
                double midibend = chan.bend * chan.bendsense;
                double bend = midibend + ins.ains.noteOffset;
                double phase = 0.0;
                uint8_t vibrato = std::max(chan.vibrato, chan.aftertouch);

                vibrato = std::max(vibrato, info.vibrato);

                if((ains.flags & OpnInstMeta::Flag_Pseudo8op) && ins.ains == ains.op[1])
                {
                    phase = ains.voice2_fine_tune;
                }

                if(vibrato && (d.is_end() || d->value.vibdelay_us >= chan.vibdelay_us))
                    bend += static_cast<double>(vibrato) * chan.vibdepth * std::sin(chan.vibpos);

                synth.noteOn(c, currentTone + bend + phase);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, static_cast<int>(midiins), vol, midibend);
            }
        }
    }

    if(info.chip_channels_count == 0)
    {
        m_midiChannels[midCh].cleanupNote(i);
        m_midiChannels[midCh].activenotes.erase(i);
    }
}